

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

void xmlSchematronParseRule
               (xmlSchematronParserCtxtPtr ctxt,xmlSchematronPatternPtr_conflict pattern,
               xmlNodePtr rule)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlSchematronRulePtr_conflict rule_00;
  xmlChar *pxVar3;
  xmlSchematronTestPtr_conflict pxVar4;
  xmlSchematronTestPtr_conflict testptr;
  xmlSchematronRulePtr_conflict ruleptr;
  xmlChar *report;
  xmlChar *context;
  xmlChar *test;
  _xmlNode *p_Stack_28;
  int nbChecks;
  xmlNodePtr cur;
  xmlNodePtr rule_local;
  xmlSchematronPatternPtr_conflict pattern_local;
  xmlSchematronParserCtxtPtr ctxt_local;
  
  test._4_4_ = 0;
  if ((ctxt != (xmlSchematronParserCtxtPtr)0x0) && (rule != (xmlNodePtr)0x0)) {
    pxVar2 = xmlGetNoNsProp(rule,"context");
    if (pxVar2 == (xmlChar *)0x0) {
      xmlSchematronPErr(ctxt,rule,0x6df,"rule has no context attribute",(xmlChar *)0x0,
                        (xmlChar *)0x0);
    }
    else if (*pxVar2 == '\0') {
      xmlSchematronPErr(ctxt,rule,0x6df,"rule has an empty context attribute",(xmlChar *)0x0,
                        (xmlChar *)0x0);
      (*xmlFree)(pxVar2);
    }
    else {
      rule_00 = xmlSchematronAddRule(ctxt,ctxt->schema,pattern,rule,pxVar2,(xmlChar *)0x0);
      if (rule_00 == (xmlSchematronRulePtr_conflict)0x0) {
        (*xmlFree)(pxVar2);
      }
      else {
        p_Stack_28 = rule->children;
        while ((p_Stack_28 != (_xmlNode *)0x0 &&
               (((p_Stack_28->type != XML_ELEMENT_NODE || (p_Stack_28->ns == (xmlNs *)0x0)) ||
                ((iVar1 = xmlStrEqual(p_Stack_28->ns->href,xmlSchematronNs), iVar1 == 0 &&
                 (iVar1 = xmlStrEqual(p_Stack_28->ns->href,xmlOldSchematronNs), iVar1 == 0))))))) {
          p_Stack_28 = p_Stack_28->next;
        }
        while (p_Stack_28 != (xmlNode *)0x0) {
          if (((((p_Stack_28 == (xmlNode *)0x0) || (p_Stack_28->type != XML_ELEMENT_NODE)) ||
               (p_Stack_28->ns == (xmlNs *)0x0)) ||
              (iVar1 = xmlStrEqual(p_Stack_28->name,"assert"), iVar1 == 0)) ||
             ((iVar1 = xmlStrEqual(p_Stack_28->ns->href,xmlSchematronNs), iVar1 == 0 &&
              (iVar1 = xmlStrEqual(p_Stack_28->ns->href,xmlOldSchematronNs), iVar1 == 0)))) {
            if ((((p_Stack_28 == (xmlNode *)0x0) ||
                 ((p_Stack_28->type != XML_ELEMENT_NODE || (p_Stack_28->ns == (xmlNs *)0x0)))) ||
                (iVar1 = xmlStrEqual(p_Stack_28->name,"report"), iVar1 == 0)) ||
               ((iVar1 = xmlStrEqual(p_Stack_28->ns->href,xmlSchematronNs), iVar1 == 0 &&
                (iVar1 = xmlStrEqual(p_Stack_28->ns->href,xmlOldSchematronNs), iVar1 == 0)))) {
              xmlSchematronPErr(ctxt,p_Stack_28,0x6df,
                                "Expecting an assert or a report element instead of %s",
                                p_Stack_28->name,(xmlChar *)0x0);
            }
            else {
              test._4_4_ = test._4_4_ + 1;
              pxVar2 = xmlGetNoNsProp(p_Stack_28,"test");
              if (pxVar2 == (xmlChar *)0x0) {
                xmlSchematronPErr(ctxt,p_Stack_28,0x6df,"assert has no test attribute",
                                  (xmlChar *)0x0,(xmlChar *)0x0);
              }
              else if (*pxVar2 == '\0') {
                xmlSchematronPErr(ctxt,p_Stack_28,0x6df,"assert has an empty test attribute",
                                  (xmlChar *)0x0,(xmlChar *)0x0);
                (*xmlFree)(pxVar2);
              }
              else {
                pxVar3 = xmlNodeGetContent(p_Stack_28);
                pxVar4 = xmlSchematronAddTest
                                   (ctxt,XML_SCHEMATRON_REPORT,rule_00,p_Stack_28,pxVar2,pxVar3);
                if (pxVar4 == (xmlSchematronTestPtr_conflict)0x0) {
                  (*xmlFree)(pxVar2);
                }
              }
            }
          }
          else {
            test._4_4_ = test._4_4_ + 1;
            pxVar2 = xmlGetNoNsProp(p_Stack_28,"test");
            if (pxVar2 == (xmlChar *)0x0) {
              xmlSchematronPErr(ctxt,p_Stack_28,0x6df,"assert has no test attribute",(xmlChar *)0x0,
                                (xmlChar *)0x0);
            }
            else if (*pxVar2 == '\0') {
              xmlSchematronPErr(ctxt,p_Stack_28,0x6df,"assert has an empty test attribute",
                                (xmlChar *)0x0,(xmlChar *)0x0);
              (*xmlFree)(pxVar2);
            }
            else {
              pxVar3 = xmlNodeGetContent(p_Stack_28);
              pxVar4 = xmlSchematronAddTest
                                 (ctxt,XML_SCHEMATRON_ASSERT,rule_00,p_Stack_28,pxVar2,pxVar3);
              if (pxVar4 == (xmlSchematronTestPtr_conflict)0x0) {
                (*xmlFree)(pxVar2);
              }
            }
          }
          p_Stack_28 = p_Stack_28->next;
          while ((p_Stack_28 != (_xmlNode *)0x0 &&
                 (((p_Stack_28->type != XML_ELEMENT_NODE || (p_Stack_28->ns == (xmlNs *)0x0)) ||
                  ((iVar1 = xmlStrEqual(p_Stack_28->ns->href,xmlSchematronNs), iVar1 == 0 &&
                   (iVar1 = xmlStrEqual(p_Stack_28->ns->href,xmlOldSchematronNs), iVar1 == 0)))))))
          {
            p_Stack_28 = p_Stack_28->next;
          }
        }
        if (test._4_4_ == 0) {
          xmlSchematronPErr(ctxt,rule,0x6df,"rule has no assert nor report element",(xmlChar *)0x0,
                            (xmlChar *)0x0);
        }
      }
    }
  }
  return;
}

Assistant:

static void
xmlSchematronParseRule(xmlSchematronParserCtxtPtr ctxt,
                       xmlSchematronPatternPtr pattern,
		       xmlNodePtr rule)
{
    xmlNodePtr cur;
    int nbChecks = 0;
    xmlChar *test;
    xmlChar *context;
    xmlChar *report;
    xmlSchematronRulePtr ruleptr;
    xmlSchematronTestPtr testptr;

    if ((ctxt == NULL) || (rule == NULL)) return;

    context = xmlGetNoNsProp(rule, BAD_CAST "context");
    if (context == NULL) {
	xmlSchematronPErr(ctxt, rule,
	    XML_SCHEMAP_NOROOT,
	    "rule has no context attribute",
	    NULL, NULL);
	return;
    } else if (context[0] == 0) {
	xmlSchematronPErr(ctxt, rule,
	    XML_SCHEMAP_NOROOT,
	    "rule has an empty context attribute",
	    NULL, NULL);
	xmlFree(context);
	return;
    } else {
	ruleptr = xmlSchematronAddRule(ctxt, ctxt->schema, pattern,
	                               rule, context, NULL);
	if (ruleptr == NULL) {
	    xmlFree(context);
	    return;
	}
    }

    cur = rule->children;
    NEXT_SCHEMATRON(cur);
    while (cur != NULL) {
	if (IS_SCHEMATRON(cur, "assert")) {
	    nbChecks++;
	    test = xmlGetNoNsProp(cur, BAD_CAST "test");
	    if (test == NULL) {
		xmlSchematronPErr(ctxt, cur,
		    XML_SCHEMAP_NOROOT,
		    "assert has no test attribute",
		    NULL, NULL);
	    } else if (test[0] == 0) {
		xmlSchematronPErr(ctxt, cur,
		    XML_SCHEMAP_NOROOT,
		    "assert has an empty test attribute",
		    NULL, NULL);
		xmlFree(test);
	    } else {
		/* TODO will need dynamic processing instead */
		report = xmlNodeGetContent(cur);

		testptr = xmlSchematronAddTest(ctxt, XML_SCHEMATRON_ASSERT,
		                               ruleptr, cur, test, report);
		if (testptr == NULL)
		    xmlFree(test);
	    }
	} else if (IS_SCHEMATRON(cur, "report")) {
	    nbChecks++;
	    test = xmlGetNoNsProp(cur, BAD_CAST "test");
	    if (test == NULL) {
		xmlSchematronPErr(ctxt, cur,
		    XML_SCHEMAP_NOROOT,
		    "assert has no test attribute",
		    NULL, NULL);
	    } else if (test[0] == 0) {
		xmlSchematronPErr(ctxt, cur,
		    XML_SCHEMAP_NOROOT,
		    "assert has an empty test attribute",
		    NULL, NULL);
		xmlFree(test);
	    } else {
		/* TODO will need dynamic processing instead */
		report = xmlNodeGetContent(cur);

		testptr = xmlSchematronAddTest(ctxt, XML_SCHEMATRON_REPORT,
		                               ruleptr, cur, test, report);
		if (testptr == NULL)
		    xmlFree(test);
	    }
	} else {
	    xmlSchematronPErr(ctxt, cur,
		XML_SCHEMAP_NOROOT,
		"Expecting an assert or a report element instead of %s",
		cur->name, NULL);
	}
	cur = cur->next;
	NEXT_SCHEMATRON(cur);
    }
    if (nbChecks == 0) {
	xmlSchematronPErr(ctxt, rule,
	    XML_SCHEMAP_NOROOT,
	    "rule has no assert nor report element", NULL, NULL);
    }
}